

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainLoop.h
# Opt level: O1

void __thiscall MainLoop::p_Update(MainLoop *this)

{
  pointer pfVar1;
  pointer pfVar2;
  duration dVar3;
  function<void_()> *odU;
  _Any_data *p_Var4;
  function<void_()> *oU;
  float fVar5;
  float local_28;
  float local_24;
  
  pfVar2 = onUpdate.
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (p_Var4 = (_Any_data *)
                onUpdate.
                super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                ._M_impl.super__Vector_impl_data._M_start; p_Var4 != (_Any_data *)pfVar2;
      p_Var4 = p_Var4 + 2) {
    if (*(long *)(p_Var4 + 1) == 0) goto LAB_00103a9e;
    (**(code **)(p_Var4->_M_pod_data + 0x18))(p_Var4);
  }
  if (p_Update()::lastTime == '\0') {
    p_Update();
  }
  dVar3.__r = std::chrono::_V2::system_clock::now();
  pfVar1 = onDeltaUpdate.
           super__Vector_base<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  fVar5 = (float)(dVar3.__r - (long)p_Update::lastTime.__d.__r) / 1e+09;
  p_Update::lastTime.__d.__r = (duration)(duration)dVar3.__r;
  if (onDeltaUpdate.
      super__Vector_base<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      onDeltaUpdate.
      super__Vector_base<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var4 = (_Any_data *)
             onDeltaUpdate.
             super__Vector_base<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_28 = fVar5;
      if (*(long *)(p_Var4 + 1) == 0) goto LAB_00103a9e;
      (**(code **)(p_Var4->_M_pod_data + 0x18))(p_Var4,&local_28);
      p_Var4 = p_Var4 + 2;
    } while (p_Var4 != (_Any_data *)pfVar1);
  }
  pfVar2 = onDelayedUpdate.
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  p_Update::delayedUpdateTimeoutSoFar = fVar5 + p_Update::delayedUpdateTimeoutSoFar;
  p_Var4 = (_Any_data *)
           onDelayedUpdate.
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (this->p_delay_length <= p_Update::delayedUpdateTimeoutSoFar &&
      p_Update::delayedUpdateTimeoutSoFar != this->p_delay_length) {
    for (; pfVar1 = onDelayedDeltaUpdate.
                    super__Vector_base<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish, p_Var4 != (_Any_data *)pfVar2;
        p_Var4 = p_Var4 + 2) {
      if (*(long *)(p_Var4 + 1) == 0) goto LAB_00103a9e;
      (**(code **)(p_Var4->_M_pod_data + 0x18))(p_Var4);
    }
    if (onDelayedDeltaUpdate.
        super__Vector_base<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        onDelayedDeltaUpdate.
        super__Vector_base<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      p_Var4 = (_Any_data *)
               onDelayedDeltaUpdate.
               super__Vector_base<std::function<void_(float)>,_std::allocator<std::function<void_(float)>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_24 = p_Update::delayedUpdateTimeoutSoFar;
        if (*(long *)(p_Var4 + 1) == 0) {
LAB_00103a9e:
          std::__throw_bad_function_call();
        }
        (**(code **)(p_Var4->_M_pod_data + 0x18))(p_Var4,&local_24);
        p_Var4 = p_Var4 + 2;
      } while (p_Var4 != (_Any_data *)pfVar1);
    }
    p_Update::delayedUpdateTimeoutSoFar = 0.0;
  }
  return;
}

Assistant:

void MainLoop::p_Update()
{

	for (const auto &oU : onUpdate)
	{
		oU();
	}

	static std::chrono::system_clock::time_point currTime;
	static std::chrono::system_clock::time_point lastTime = std::chrono::system_clock::now();
	static std::chrono::duration<float> deltaTime;

	currTime = std::chrono::system_clock::now();
	deltaTime = currTime - lastTime;
	lastTime = currTime;

	float elapsedTime = deltaTime.count();
	for (const auto &oDU : onDeltaUpdate)
	{
		oDU(elapsedTime);
	}

	static float delayedUpdateTimeoutSoFar = 0.f;
	delayedUpdateTimeoutSoFar += elapsedTime;
	if (delayedUpdateTimeoutSoFar > p_delay_length)
	{
		for (auto &odU : onDelayedUpdate)
		{
			odU();
		}
		for (auto &odDU : onDelayedDeltaUpdate)
		{
			odDU(delayedUpdateTimeoutSoFar); //combines all missed delta time since last update
		}
		delayedUpdateTimeoutSoFar = 0.f; // reset
	}
}